

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_mark.cpp
# Opt level: O2

Read<signed_char> __thiscall
Omega_h::mark_up_all
          (Omega_h *this,Mesh *mesh,Int low_dim,Int high_dim,Read<signed_char> *low_marked)

{
  uint size_in;
  undefined *puVar1;
  long lVar2;
  void *extraout_RDX;
  ulong uVar3;
  ulong uVar4;
  undefined1 uVar5;
  ulong uVar6;
  bool bVar7;
  Read<signed_char> RVar8;
  Write<signed_char> out;
  Write<signed_char> local_128;
  LOs hl2l;
  undefined1 local_108 [16];
  undefined1 local_f8 [16];
  long local_e8;
  Write<signed_char> local_e0;
  uint local_d0 [2];
  Write<int> local_c8;
  Write<signed_char> local_b8;
  Write<signed_char> local_a8;
  type f;
  Adj l2h;
  
  Mesh::ask_down(&l2h,mesh,high_dim,low_dim);
  f.deg = 0xffffffff;
  if (mesh->family_ == OMEGA_H_SIMPLEX) {
    switch(high_dim) {
    case 0:
      f.deg = 1;
      goto switchD_002bf843_default;
    case 1:
      goto switchD_002bf843_caseD_1;
    case 2:
      bVar7 = low_dim == 2;
      if ((uint)low_dim < 2) {
        f.deg = 3;
        goto switchD_002bf843_default;
      }
      break;
    case 3:
      bVar7 = low_dim == 3;
      if ((uint)low_dim < 3) {
        puVar1 = &DAT_0037f84c;
        goto LAB_002bf8ad;
      }
      break;
    default:
      goto switchD_002bf843_default;
    }
    goto LAB_002bf8b8;
  }
  switch(high_dim) {
  case 0:
    f.deg = -(uint)(low_dim != 0) | 1;
    goto switchD_002bf843_default;
  case 1:
switchD_002bf843_caseD_1:
    f.deg = 2;
    if (low_dim == 0) goto switchD_002bf843_default;
    bVar7 = low_dim == 1;
    break;
  case 2:
    bVar7 = low_dim == 2;
    if ((uint)low_dim < 2) {
      f.deg = 4;
      goto switchD_002bf843_default;
    }
    break;
  case 3:
    bVar7 = low_dim == 3;
    if ((uint)low_dim < 3) {
      puVar1 = &DAT_0037f858;
LAB_002bf8ad:
      f.deg = *(Int *)(puVar1 + (ulong)(uint)low_dim * 4);
      goto switchD_002bf843_default;
    }
    break;
  default:
    goto switchD_002bf843_default;
  }
LAB_002bf8b8:
  f.deg = (uint)bVar7 * 2 - 1;
switchD_002bf843_default:
  Write<int>::Write(&hl2l.write_,&l2h.super_Graph.ab2b.write_);
  size_in = Mesh::nents(mesh,high_dim);
  std::__cxx11::string::string((string *)local_108,"",(allocator *)local_d0);
  Write<signed_char>::Write(&out,size_in,'\0',(string *)local_108);
  std::__cxx11::string::~string((string *)local_108);
  Write<int>::Write(&f.hl2l.write_,&hl2l.write_);
  Write<signed_char>::Write(&f.low_marked.write_,&low_marked->write_);
  Write<signed_char>::Write(&f.out,&out);
  local_d0[0] = f.deg;
  Write<int>::Write(&local_c8,&f.hl2l.write_);
  Write<signed_char>::Write(&local_b8,&f.low_marked.write_);
  Write<signed_char>::Write(&local_a8,&f.out);
  if (0 < (int)size_in) {
    entering_parallel = 1;
    local_108._0_4_ = local_d0[0];
    Write<int>::Write((Write<int> *)(local_108 + 8),&local_c8);
    Write<signed_char>::Write((Write<signed_char> *)(local_f8 + 8),&local_b8);
    Write<signed_char>::Write(&local_e0,&local_a8);
    entering_parallel = 0;
    lVar2 = 0;
    for (uVar3 = 0; uVar3 != size_in; uVar3 = uVar3 + 1) {
      uVar4 = 0;
      if (0 < (int)local_108._0_4_) {
        uVar4 = (ulong)(uint)local_108._0_4_;
      }
      uVar5 = 1;
      for (uVar6 = 0; uVar4 != uVar6; uVar6 = uVar6 + 1) {
        if (*(char *)(local_e8 + *(int *)((int)local_108._0_4_ * lVar2 + local_f8._0_8_ + uVar6 * 4)
                     ) == '\0') {
          uVar5 = 0;
        }
      }
      *(undefined1 *)((long)local_e0.shared_alloc_.direct_ptr + uVar3) = uVar5;
      lVar2 = lVar2 + 4;
    }
    mark_up_all(Omega_h::Mesh*,int,int,Omega_h::Read<signed_char>)::$_0::~__0((__0 *)local_108);
  }
  mark_up_all(Omega_h::Mesh*,int,int,Omega_h::Read<signed_char>)::$_0::~__0((__0 *)local_d0);
  Write<signed_char>::Write(&local_128,&out);
  Read<signed_char>::Read((Read<signed_char> *)this,&local_128);
  Write<signed_char>::~Write(&local_128);
  mark_up_all(Omega_h::Mesh*,int,int,Omega_h::Read<signed_char>)::$_0::~__0((__0 *)&f);
  Write<signed_char>::~Write(&out);
  Write<int>::~Write(&hl2l.write_);
  Adj::~Adj(&l2h);
  RVar8.write_.shared_alloc_.direct_ptr = extraout_RDX;
  RVar8.write_.shared_alloc_.alloc = (Alloc *)this;
  return (Read<signed_char>)RVar8.write_.shared_alloc_;
}

Assistant:

Read<I8> mark_up_all(
    Mesh* mesh, Int low_dim, Int high_dim, Read<I8> low_marked) {
  auto l2h = mesh->ask_down(high_dim, low_dim);
  auto deg = element_degree(mesh->family(), high_dim, low_dim);
  auto hl2l = l2h.ab2b;
  auto nh = mesh->nents(high_dim);
  Write<I8> out(nh, 0);
  auto f = OMEGA_H_LAMBDA(LO h) {
    bool all_marked = true;
    for (Int hhl = 0; hhl < deg; ++hhl) {
      auto l = hl2l[h * deg + hhl];
      if (!low_marked[l]) all_marked = false;
    }
    out[h] = I8(all_marked);
  };
  parallel_for(nh, f, "mark_up_all");
  return out;
}